

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLGeometryLoader.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL::GeometryLoader::begin__spline
          (GeometryLoader *this,spline__AttributeData *attributeData)

{
  COLLADAVersion CVar1;
  SplineLoader *this_00;
  IParserImpl14 *this_01;
  
  this_00 = (SplineLoader *)operator_new(0x138);
  SplineLoader::SplineLoader
            (this_00,(IFilePartLoader *)this,&this->mGeometryId,&this->mGeometryName);
  this->mSplineLoader = this_00;
  (this->super_FilePartLoader).super_IFilePartLoader.mPartLoader = (IFilePartLoader *)this_00;
  CVar1 = ((this->super_FilePartLoader).super_IFilePartLoader.mParserImpl)->mCOLLADAVersion;
  if (CVar1 == COLLADA_14) {
    this_01 = (IParserImpl14 *)operator_new(0x28);
    IParserImpl14::IParserImpl14(this_01);
    this_01[1].super_IParserImpl._vptr_IParserImpl = (_func_int **)this_00;
    (this_01->super_IParserImpl)._vptr_IParserImpl = (_func_int **)&PTR__IParserImpl14_00934f48;
    (this_01->super_ColladaParserAutoGen14)._vptr_ColladaParserAutoGen14 =
         (_func_int **)&PTR__SplineLoader14_00935018;
    *(SplineLoader **)&this_01[1].super_IParserImpl.mCOLLADAVersion = this_00;
    (this->mSplineLoader->super_SourceArrayLoader).super_FilePartLoader.super_IFilePartLoader.
    mParserImpl = (IParserImpl *)this_01;
    (*(this->super_FilePartLoader).super_IFilePartLoader.super_ExtraDataLoader._vptr_ExtraDataLoader
      [9])(this,&this_01->super_ColladaParserAutoGen14);
  }
  else if (CVar1 == COLLADA_15) {
    return false;
  }
  return true;
}

Assistant:

bool GeometryLoader::begin__spline(const spline__AttributeData & attributeData)
    {
        mSplineLoader = new SplineLoader(this, mGeometryId, mGeometryName);
        setPartLoader(mSplineLoader);
        switch (this->getParserImpl()->getCOLLADAVersion())
        {
        case COLLADA_14:
            {
                SplineLoader14* splineloader14 = new SplineLoader14( mSplineLoader );
                mSplineLoader->setParserImpl(splineloader14);
                setParser(splineloader14);
                break;
            }
        case COLLADA_15:
            {
                return false;
                break;
            }
        default:
            break;
        }
        return true;
    }